

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

PieceType banksia::BoardCore::charactorToPieceType(char ch)

{
  char *pcVar1;
  char in_DIL;
  int k;
  char *p;
  PieceType pieceType;
  undefined1 local_1;
  
  local_1 = in_DIL;
  if (('@' < in_DIL) && (in_DIL < 'Z')) {
    local_1 = in_DIL + ' ';
  }
  pcVar1 = strchr(pieceTypeName,(int)local_1);
  return (int)pcVar1 - (int)pieceTypeName;
}

Assistant:

PieceType BoardCore::charactorToPieceType(char ch)
{
    if (ch >= 'A' && ch < 'Z') {
        ch += 'a' - 'A';
    }
    auto pieceType = PieceType::empty;
    const char* p = strchr(pieceTypeName, ch);
    int k = int(p - pieceTypeName);
    pieceType = static_cast<PieceType>(k);
    return pieceType;
}